

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O0

void __thiscall
re2c::GoBitmap::GoBitmap
          (GoBitmap *this,Span *span,uint32_t nSpans,Span *hspan,uint32_t hSpans,BitMap *bm,
          State *bm_state,State *next)

{
  uint32_t nsp;
  Span *new_span;
  State *local_b8;
  SwitchIf *local_98;
  SwitchIf *local_88;
  uint32_t bSpans;
  Span *bspan;
  BitMap *bm_local;
  uint32_t hSpans_local;
  Span *hspan_local;
  uint32_t nSpans_local;
  Span *span_local;
  GoBitmap *this_local;
  
  this->bitmap = bm;
  this->bitmap_state = bm_state;
  this->hgo = (SwitchIf *)0x0;
  this->lgo = (SwitchIf *)0x0;
  new_span = allocate<re2c::Span>((ulong)nSpans);
  nsp = unmap(new_span,span,nSpans,bm_state);
  if (nsp == 0) {
    local_88 = (SwitchIf *)0x0;
  }
  else {
    local_88 = (SwitchIf *)operator_new(0x10);
    SwitchIf::SwitchIf(local_88,new_span,nsp,next);
  }
  this->lgo = local_88;
  if (hSpans == 0) {
    local_98 = (SwitchIf *)0x0;
  }
  else {
    local_98 = (SwitchIf *)operator_new(0x10);
    if (this->lgo == (SwitchIf *)0x0) {
      local_b8 = next;
    }
    else {
      local_b8 = (State *)0x0;
    }
    SwitchIf::SwitchIf(local_98,hspan,hSpans,local_b8);
  }
  this->hgo = local_98;
  operator_delete(new_span);
  return;
}

Assistant:

GoBitmap::GoBitmap (const Span * span, uint32_t nSpans, const Span * hspan, uint32_t hSpans, const BitMap * bm, const State * bm_state, const State * next)
	: bitmap (bm)
	, bitmap_state (bm_state)
	, hgo (NULL)
	, lgo (NULL)
{
	Span * bspan = allocate<Span> (nSpans);
	uint32_t bSpans = unmap (bspan, span, nSpans, bm_state);
	lgo = bSpans == 0
		? NULL
		:  new SwitchIf (bspan, bSpans, next);
	// if there are any low spans, then next state for high spans
	// must be NULL to trigger explicit goto generation in linear 'if'
	hgo = hSpans == 0
		? NULL
		: new SwitchIf (hspan, hSpans, lgo ? NULL : next);
	operator delete (bspan);
}